

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O0

Reals Omega_h::repeat_vector<9>(LO n,Vector<9> v)

{
  void *extraout_RDX;
  int in_ESI;
  undefined4 in_register_0000003c;
  Reals RVar1;
  Write<double> local_c8;
  undefined1 local_b8 [8];
  type_conflict4 f;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  Write<double> vs;
  LO n_local;
  
  vs.shared_alloc_.direct_ptr._4_4_ = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  Write<double>::Write((Write<double> *)local_28,in_ESI * 9,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  Write<double>::Write((Write<double> *)local_b8,(Write<double> *)local_28);
  f.v.super_Few<double,_9>.array_[7] = v.super_Few<double,_9>.array_[8];
  f.vs.shared_alloc_.direct_ptr = (void *)v.super_Few<double,_9>.array_[0];
  f.v.super_Few<double,_9>.array_[0] = v.super_Few<double,_9>.array_[1];
  f.v.super_Few<double,_9>.array_[1] = v.super_Few<double,_9>.array_[2];
  f.v.super_Few<double,_9>.array_[2] = v.super_Few<double,_9>.array_[3];
  f.v.super_Few<double,_9>.array_[3] = v.super_Few<double,_9>.array_[4];
  f.v.super_Few<double,_9>.array_[4] = v.super_Few<double,_9>.array_[5];
  f.v.super_Few<double,_9>.array_[5] = v.super_Few<double,_9>.array_[6];
  f.v.super_Few<double,_9>.array_[6] = v.super_Few<double,_9>.array_[7];
  parallel_for<Omega_h::repeat_vector<9>(int,Omega_h::Vector<9>)::_lambda(int)_1_>
            (vs.shared_alloc_.direct_ptr._4_4_,(type_conflict4 *)local_b8,"repeat_vector");
  Write<double>::Write(&local_c8,(Write<signed_char> *)local_28);
  Read<double>::Read((Read<double> *)CONCAT44(in_register_0000003c,n),&local_c8);
  Write<double>::~Write(&local_c8);
  repeat_vector<9>(int,Omega_h::Vector<9>)::{lambda(int)#1}::~Vector((_lambda_int__1_ *)local_b8);
  Write<double>::~Write((Write<double> *)local_28);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)CONCAT44(in_register_0000003c,n);
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals repeat_vector(LO n, Vector<dim> v) {
  Write<Real> vs(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) { set_vector(vs, i, v); };
  parallel_for(n, f, "repeat_vector");
  return vs;
}